

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O1

size_t duckdb_zstd::FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  int iVar6;
  FSE_CTable FVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  FSE_CTable FVar11;
  long lVar12;
  uint uVar13;
  ushort uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t s;
  long lVar20;
  uint uVar21;
  ulong uVar23;
  uint uVar24;
  size_t u;
  ulong uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar22;
  
  uVar24 = 1 << ((byte)tableLog & 0x1f);
  uVar19 = (ulong)uVar24;
  uVar18 = 1;
  if (tableLog != 0) {
    uVar18 = (ulong)(uVar24 >> 1);
  }
  uVar21 = maxSymbolValue + 2;
  uVar22 = (ulong)uVar21;
  sVar5 = 0xffffffffffffffd4;
  if (((1L << ((byte)tableLog & 0x3f)) + uVar22 & 0xfffffffffffffffe) * 2 + 8 <= wkspSize) {
    uVar13 = uVar24 - 1;
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    *(undefined2 *)workSpace = 0;
    uVar9 = maxSymbolValue + 1;
    uVar26 = uVar13;
    if (uVar9 != 0) {
      uVar8 = 2;
      if (2 < uVar21) {
        uVar8 = (ulong)uVar21;
      }
      lVar16 = 0;
      do {
        sVar1 = *(short *)((long)workSpace + lVar16 * 2);
        if (normalizedCounter[lVar16] == -1) {
          *(short *)((long)workSpace + lVar16 * 2 + 2) = sVar1 + 1;
          uVar23 = (ulong)uVar26;
          uVar26 = uVar26 - 1;
          *(char *)((long)workSpace + uVar23 + uVar22 * 2) = (char)lVar16;
        }
        else {
          *(short *)((long)workSpace + lVar16 * 2 + 2) = sVar1 + normalizedCounter[lVar16];
        }
        lVar16 = lVar16 + 1;
      } while (uVar8 - 1 != lVar16);
    }
    iVar6 = (uVar24 >> 3) + (uVar24 >> 1) + 3;
    uVar8 = (ulong)uVar9;
    *(short *)((long)workSpace + uVar8 * 2) = (short)uVar24 + 1;
    auVar4 = _DAT_01dd7b40;
    auVar3 = _DAT_01dd7b30;
    if (uVar26 == uVar13) {
      lVar16 = (long)workSpace + uVar19 + uVar22 * 2;
      if (uVar9 != 0) {
        uVar23 = 0;
        lVar20 = 0;
        lVar12 = 0;
        do {
          uVar2 = normalizedCounter[uVar23];
          *(long *)(lVar16 + lVar20) = lVar12;
          if (8 < (long)(short)uVar2) {
            uVar14 = 0x10;
            if (0x10 < uVar2) {
              uVar14 = uVar2;
            }
            uVar17 = (ulong)uVar14 - 9;
            auVar29._8_4_ = (int)uVar17;
            auVar29._0_8_ = uVar17;
            auVar29._12_4_ = (int)(uVar17 >> 0x20);
            auVar27._0_8_ = uVar17 >> 3;
            auVar27._8_8_ = auVar29._8_8_ >> 3;
            auVar27 = auVar27 ^ auVar4;
            uVar25 = 0;
            do {
              auVar28._8_4_ = (int)uVar25;
              auVar28._0_8_ = uVar25;
              auVar28._12_4_ = (int)(uVar25 >> 0x20);
              auVar29 = (auVar28 | auVar3) ^ auVar4;
              if ((bool)(~(auVar27._4_4_ < auVar29._4_4_ ||
                          auVar27._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar27._4_4_) & 1)) {
                *(long *)(lVar16 + lVar20 + 8 + uVar25 * 8) = lVar12;
              }
              if (auVar29._12_4_ <= auVar27._12_4_ &&
                  (auVar29._8_4_ <= auVar27._8_4_ || auVar29._12_4_ != auVar27._12_4_)) {
                *(long *)(lVar16 + lVar20 + 0x10 + uVar25 * 8) = lVar12;
              }
              uVar25 = uVar25 + 2;
            } while (((uVar17 >> 3) + 2 & 0xfffffffffffffffe) != uVar25);
          }
          lVar20 = lVar20 + (short)uVar2;
          uVar23 = uVar23 + 1;
          lVar12 = lVar12 + 0x101010101010101;
        } while (uVar23 != uVar8);
      }
      uVar8 = 0;
      uVar21 = 0;
      do {
        lVar12 = 0;
        uVar26 = uVar21;
        do {
          *(undefined1 *)((long)workSpace + (ulong)(uVar26 & uVar13) + uVar22 * 2) =
               *(undefined1 *)(lVar16 + lVar12);
          lVar12 = lVar12 + 1;
          uVar26 = uVar26 + iVar6;
        } while (lVar12 == 1);
        uVar21 = uVar21 + iVar6 * 2 & uVar13;
        uVar8 = uVar8 + 2;
        lVar16 = lVar16 + 2;
      } while (uVar8 < uVar19);
    }
    else if (uVar9 != 0) {
      uVar23 = 0;
      uVar17 = 0;
      do {
        sVar1 = normalizedCounter[uVar23];
        if (0 < sVar1) {
          iVar10 = 0;
          do {
            *(char *)((long)workSpace + uVar17 + uVar22 * 2) = (char)uVar23;
            do {
              uVar21 = (int)uVar17 + iVar6 & uVar13;
              uVar17 = (ulong)uVar21;
            } while (uVar26 < uVar21);
            iVar10 = iVar10 + 1;
          } while (iVar10 != sVar1);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar8);
    }
    uVar8 = 0;
    do {
      uVar23 = (ulong)*(byte *)((long)workSpace + uVar8 + uVar22 * 2);
      uVar2 = *(ushort *)((long)workSpace + uVar23 * 2);
      *(ushort *)((long)workSpace + uVar23 * 2) = uVar2 + 1;
      *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = (short)uVar24 + (short)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar19 != uVar8);
    FVar7 = tableLog * 0x10000 - uVar24;
    sVar5 = 0;
    uVar19 = 0;
    iVar6 = 0;
    do {
      sVar1 = normalizedCounter[uVar19];
      if ((sVar1 == -1) || (sVar1 == 1)) {
        ct[uVar18 + uVar19 * 2 + 2] = FVar7;
        ct[uVar18 + uVar19 * 2 + 1] = iVar6 - 1;
        iVar6 = iVar6 + 1;
      }
      else if (sVar1 == 0) {
        ct[uVar18 + uVar19 * 2 + 2] = FVar7 + 0x10000;
      }
      else {
        iVar15 = (int)sVar1;
        iVar10 = 0x1f;
        if (iVar15 - 1U != 0) {
          for (; iVar15 - 1U >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        FVar11 = iVar6 - iVar15;
        iVar6 = iVar6 + iVar15;
        ct[uVar18 + uVar19 * 2 + 2] =
             (tableLog - iVar10) * 0x10000 - (iVar15 << ((byte)(tableLog - iVar10) & 0x1f));
        ct[uVar18 + uVar19 * 2 + 1] = FVar11;
      }
      uVar19 = uVar19 + 1;
    } while (uVar9 + (uVar9 == 0) != uVar19);
  }
  return sVar5;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}